

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O2

void __thiscall
btPerturbedContactResult::addContactPoint
          (btPerturbedContactResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar orgDepth)

{
  btScalar bVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar2;
  btVector3 endPtOrg;
  btScalar newDepth;
  btScalar local_10c;
  btScalar local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  btVector3 local_d0;
  btVector3 local_c0;
  btTransform local_b0;
  btTransform local_70;
  
  local_10c = orgDepth;
  if (this->m_perturbA == true) {
    local_b0.m_basis.m_el[0] = operator*(normalOnBInWorld,&local_10c);
    local_d0 = operator+(pointInWorld,(btVector3 *)&local_b0);
    btTransform::inverse(&local_70,&this->m_transformA);
    btTransform::operator*(&local_b0,&this->m_unPerturbedTransform,&local_70);
    local_c0 = btTransform::operator()(&local_b0,&local_d0);
    bVar2 = operator-(&local_c0,pointInWorld);
    local_b0.m_basis.m_el[0].m_floats[0] =
         bVar2.m_floats[2] * normalOnBInWorld->m_floats[2] +
         normalOnBInWorld->m_floats[0] * bVar2.m_floats[0] +
         bVar2.m_floats[1] * normalOnBInWorld->m_floats[1];
    bVar2 = operator*(normalOnBInWorld,(btScalar *)&local_b0);
    local_108[1] = local_c0.m_floats[1] + bVar2.m_floats[1];
    local_108[0] = local_c0.m_floats[0] + bVar2.m_floats[0];
    local_108[2] = bVar2.m_floats[2] + local_c0.m_floats[2];
    local_108[3] = 0.0;
    bVar1 = local_b0.m_basis.m_el[0].m_floats[0];
  }
  else {
    local_b0.m_basis.m_el[0] = operator*(normalOnBInWorld,&local_10c);
    local_c0 = operator+(pointInWorld,(btVector3 *)&local_b0);
    local_f8._8_4_ = extraout_XMM0_Dc;
    local_f8._0_8_ = local_c0.m_floats._0_8_;
    local_f8._12_4_ = extraout_XMM0_Dd;
    local_e8._8_4_ = in_XMM1_Dc;
    local_e8._0_8_ = local_c0.m_floats._8_8_;
    local_e8._12_4_ = in_XMM1_Dd;
    btTransform::inverse(&local_70,&this->m_transformB);
    btTransform::operator*(&local_b0,&this->m_unPerturbedTransform,&local_70);
    local_108 = (btScalar  [4])btTransform::operator()(&local_b0,pointInWorld);
    bVar1 = ((float)local_e8._0_4_ - local_108[2]) * normalOnBInWorld->m_floats[2] +
            normalOnBInWorld->m_floats[0] * ((float)local_f8._0_4_ - local_108[0]) +
            ((float)local_f8._4_4_ - local_108[1]) * normalOnBInWorld->m_floats[1];
    local_b0.m_basis.m_el[0].m_floats[0] = bVar1;
  }
  (*(this->m_originalManifoldResult->super_Result)._vptr_Result[4])
            (bVar1,this->m_originalManifoldResult,normalOnBInWorld,local_108);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar orgDepth)
	{
		btVector3 endPt,startPt;
		btScalar newDepth;
		btVector3 newNormal;

		if (m_perturbA)
		{
			btVector3 endPtOrg = pointInWorld + normalOnBInWorld*orgDepth;
			endPt = (m_unPerturbedTransform*m_transformA.inverse())(endPtOrg);
			newDepth = (endPt -  pointInWorld).dot(normalOnBInWorld);
			startPt = endPt+normalOnBInWorld*newDepth;
		} else
		{
			endPt = pointInWorld + normalOnBInWorld*orgDepth;
			startPt = (m_unPerturbedTransform*m_transformB.inverse())(pointInWorld);
			newDepth = (endPt -  startPt).dot(normalOnBInWorld);
			
		}

//#define DEBUG_CONTACTS 1
#ifdef DEBUG_CONTACTS
		m_debugDrawer->drawLine(startPt,endPt,btVector3(1,0,0));
		m_debugDrawer->drawSphere(startPt,0.05,btVector3(0,1,0));
		m_debugDrawer->drawSphere(endPt,0.05,btVector3(0,0,1));
#endif //DEBUG_CONTACTS

		
		m_originalManifoldResult->addContactPoint(normalOnBInWorld,startPt,newDepth);
	}